

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadLocalStorage.h
# Opt level: O3

void __thiscall TLS::BASE<tls_data_t,_1024U>::_details::~_details(_details *this)

{
  undefined8 uVar1;
  array<TLS::BASE<tls_data_t,_1024U>::data_t,_1024UL> *paVar2;
  long lVar3;
  
  pthread_key_delete(BASE<tls_data_t,1024u>::_details::_pthread_key);
  if (BASE<tls_data_t,1024u>::_details::_thread_exit_callback != 0) {
    paVar2 = &this->_data;
    lVar3 = 0x6000;
    do {
      if (paVar2->_M_elems[0]._index != 0xffffffff) {
        if (*(long *)(BASE<tls_data_t,1024u>::_details::_thread_exit_callback + 0x10) == 0) {
          uVar1 = std::__throw_bad_function_call();
          __clang_call_terminate(uVar1);
          return;
        }
        (**(code **)(BASE<tls_data_t,1024u>::_details::_thread_exit_callback + 0x18))
                  (BASE<tls_data_t,1024u>::_details::_thread_exit_callback,paVar2);
      }
      paVar2 = (array<TLS::BASE<tls_data_t,_1024U>::data_t,_1024UL> *)(paVar2->_M_elems + 1);
      lVar3 = lVar3 + -0x18;
    } while (lVar3 != 0);
  }
  return;
}

Assistant:

~_details() {
#ifdef _MSC_VER
				for (auto & x : _thread_wait_handles) {
					if (x != IVH())
						unregister_wait_thread_handle(x);
				}
#else
				int result = pthread_key_delete(_pthread_key);
				TLS_ASSERT_(result == 0); (void)result;
#endif
				if (_thread_exit_callback) {
					for (auto &x : _data) {
						if (x._index != UNUSED_INDEX)
							_thread_exit_callback->operator()(x);
					}
				}
			}